

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

string * __thiscall
re2::FlattenedProgToString_abi_cxx11_(string *__return_storage_ptr__,re2 *this,Prog *prog,int start)

{
  Inst *this_00;
  long lVar1;
  ulong uVar2;
  string local_78;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)prog < *(int *)(this + 0x10)) {
    uVar2 = (ulong)(int)prog;
    lVar1 = uVar2 * 8;
    do {
      this_00 = (Inst *)(*(long *)(this + 0x60) + lVar1);
      if ((*(byte *)(*(long *)(this + 0x60) + lVar1) & 8) == 0) {
        Prog::Inst::Dump_abi_cxx11_(&local_58,this_00);
        StringPrintf_abi_cxx11_(&local_78,"%d+ %s\n",uVar2 & 0xffffffff,local_58._M_dataplus._M_p);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
      }
      else {
        Prog::Inst::Dump_abi_cxx11_(&local_58,this_00);
        StringPrintf_abi_cxx11_(&local_78,"%d. %s\n",uVar2 & 0xffffffff,local_58._M_dataplus._M_p);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 8;
    } while ((long)uVar2 < (long)*(int *)(this + 0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FlattenedProgToString(Prog* prog, int start) {
  std::string s;
  for (int id = start; id < prog->size(); id++) {
    Prog::Inst* ip = prog->inst(id);
    if (ip->last())
      s += StringPrintf("%d. %s\n", id, ip->Dump().c_str());
    else
      s += StringPrintf("%d+ %s\n", id, ip->Dump().c_str());
  }
  return s;
}